

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_moves(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 val;
  TCGContext_conflict2 *tcg_ctx_01;
  byte bVar2;
  uint32_t uVar3;
  TCGv_i32 addr;
  TCGTemp *pTVar4;
  int32_t arg2;
  TCGv_i32 *ppTVar5;
  TCGContext_conflict2 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i32 val_00;
  uint mode;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    uVar3 = (s->base).pc_next;
    iVar7 = 8;
  }
  else {
    tcg_ctx_00 = s->uc->tcg_ctx;
    uVar3 = cpu_lduw_code_m68k(env,s->pc);
    s->pc = s->pc + 2;
    uVar6 = insn >> 6 & 3;
    uVar8 = (ulong)uVar6;
    switch(uVar6) {
    default:
      uVar8 = 0;
      bVar2 = 1;
      break;
    case 1:
    case 2:
      bVar2 = 0;
    }
    if ((short)uVar3 < 0) {
      uVar6 = uVar3 >> 0xc & 7;
      if (((uint)s->writeback_mask >> uVar6 & 1) == 0) {
        ppTVar5 = s->uc->tcg_ctx->cpu_aregs;
      }
      else {
        ppTVar5 = s->writeback;
      }
    }
    else {
      ppTVar5 = tcg_ctx_00->cpu_dregs;
      uVar6 = uVar3 >> 0xc & 7;
    }
    val = ppTVar5[uVar6];
    mode = insn >> 3 & 7;
    uVar6 = insn & 7;
    iVar7 = (int)uVar8;
    addr = gen_lea_mode(env,s,mode,uVar6,iVar7);
    if (addr != tcg_ctx_00->NULL_QREG) {
      uVar1 = ((s->base).tb)->flags;
      tcg_ctx_01 = s->uc->tcg_ctx;
      if ((uVar3 >> 0xb & 1) == 0) {
        pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx_01,TCG_TYPE_I32,false);
        val_00 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx_01);
        tcg_gen_qemu_ld_i32_m68k
                  (tcg_ctx_01,val_00,addr,(ulong)((uVar1 >> 0xe & 1) == 0),
                   *(MemOp_conflict *)(&DAT_00d7e480 + uVar8 * 4));
        if ((short)uVar3 < 0) {
          if (iVar7 == 2) {
            if (val != val_00) {
              tcg_gen_op2_m68k(tcg_ctx_00,INDEX_op_mov_i32,(TCGArg)(val + (long)tcg_ctx_00),
                               (TCGArg)((long)tcg_ctx_00 + (long)val_00));
            }
          }
          else if (iVar7 == 1) {
            tcg_gen_ext16s_i32_m68k(tcg_ctx_00,val,val_00);
          }
          else {
            tcg_gen_ext8s_i32_m68k(tcg_ctx_00,val,val_00);
          }
        }
        else {
          gen_partset_reg(tcg_ctx_00,iVar7,val,val_00);
        }
        tcg_temp_free_internal_m68k(tcg_ctx_00,(TCGTemp *)(val_00 + (long)tcg_ctx_00));
      }
      else {
        tcg_gen_qemu_st_i32_m68k
                  (tcg_ctx_01,val,addr,(ulong)(-1 < (short)uVar1),
                   *(MemOp_conflict *)(&DAT_00d7e480 + uVar8 * 4));
      }
      if (mode == 4) {
        if (((uint)s->writeback_mask >> uVar6 & 1) == 0) {
          ppTVar5 = s->uc->tcg_ctx->cpu_aregs;
        }
        else {
          ppTVar5 = s->writeback;
        }
        if (ppTVar5[uVar6] != addr) {
          tcg_gen_op2_m68k(tcg_ctx_00,INDEX_op_mov_i32,(TCGArg)(ppTVar5[uVar6] + (long)tcg_ctx_00),
                           (TCGArg)(addr + (long)tcg_ctx_00));
          return;
        }
      }
      else if (mode == 3) {
        if (((uint)s->writeback_mask >> uVar6 & 1) == 0) {
          ppTVar5 = s->uc->tcg_ctx->cpu_aregs;
        }
        else {
          ppTVar5 = s->writeback;
        }
        arg2 = 2;
        if (!(bool)(bVar2 & uVar6 == 7)) {
          arg2 = *(int32_t *)(&DAT_00d7e468 + uVar8 * 4);
        }
        tcg_gen_addi_i32_m68k(tcg_ctx_00,ppTVar5[uVar6],addr,arg2);
        return;
      }
      return;
    }
    uVar3 = (s->base).pc_next;
    iVar7 = 3;
  }
  gen_exception(s,uVar3,iVar7);
  return;
}

Assistant:

DISAS_INSN(moves)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    uint16_t ext;
    TCGv reg;
    TCGv addr;
    int extend;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }

    ext = read_im16(env, s);

    opsize = insn_opsize(insn);

    if (ext & 0x8000) {
        /* address register */
        reg = AREG(ext, 12);
        extend = 1;
    } else {
        /* data register */
        reg = DREG(ext, 12);
        extend = 0;
    }

    addr = gen_lea(env, s, insn, opsize);
    if (IS_NULL_QREG(addr)) {
        gen_addr_fault(s);
        return;
    }

    if (ext & 0x0800) {
        /* from reg to ea */
        gen_store(s, opsize, addr, reg, DFC_INDEX(s));
    } else {
        /* from ea to reg */
        TCGv tmp = gen_load(s, opsize, addr, 0, SFC_INDEX(s));
        if (extend) {
            gen_ext(tcg_ctx, reg, tmp, opsize, 1);
        } else {
            gen_partset_reg(tcg_ctx, opsize, reg, tmp);
        }
        tcg_temp_free(tcg_ctx, tmp);
    }
    switch (extract32(insn, 3, 3)) {
    case 3: /* Indirect postincrement.  */
        tcg_gen_addi_i32(tcg_ctx, AREG(insn, 0), addr,
                         REG(insn, 0) == 7 && opsize == OS_BYTE
                         ? 2
                         : opsize_bytes(opsize));
        break;
    case 4: /* Indirect predecrememnt.  */
        tcg_gen_mov_i32(tcg_ctx, AREG(insn, 0), addr);
        break;
    }
}